

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_quality.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  uint8_t *data;
  size_t data_size;
  char **local_38;
  
  iVar4 = 1;
  lVar7 = 1;
  bVar1 = false;
  local_38 = argv;
  do {
    if ((iVar4 == 0) || (argc <= lVar7)) {
      return (uint)(iVar4 == 0);
    }
    pcVar6 = local_38[lVar7];
    iVar3 = strcmp(pcVar6,"-quiet");
    bVar2 = true;
    if (iVar3 != 0) {
      iVar4 = strcmp(pcVar6,"-help");
      if ((iVar4 == 0) || (((*pcVar6 == '-' && (pcVar6[1] == 'h')) && (pcVar6[2] == '\0')))) {
        puts("webp_quality [-h][-quiet] webp_files...");
        return 0;
      }
      data = (uint8_t *)0x0;
      data_size = 0;
      iVar4 = ImgIoUtilReadFile(pcVar6,&data,&data_size);
      if (iVar4 == 0) {
        return 1;
      }
      uVar5 = VP8EstimateQuality(data,data_size);
      if (bVar1) {
        if ((int)uVar5 < 0) goto LAB_00103452;
        pcVar6 = "%d\n";
LAB_00103434:
        printf(pcVar6,(ulong)uVar5);
      }
      else {
        printf("[%s] ",pcVar6);
        if (-1 < (int)uVar5) {
          pcVar6 = "Estimated quality factor: %d\n";
          goto LAB_00103434;
        }
LAB_00103452:
        fwrite("Not a WebP file, or not a lossy WebP file.\n",0x2b,1,_stderr);
        iVar4 = 0;
      }
      free(data);
      bVar2 = bVar1;
    }
    bVar1 = bVar2;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  int c;
  int quiet = 0;
  int ok = 1;

  INIT_WARGV(argc, argv);

  for (c = 1; ok && c < argc; ++c) {
    if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-help") || !strcmp(argv[c], "-h")) {
      printf("webp_quality [-h][-quiet] webp_files...\n");
      FREE_WARGV_AND_RETURN(0);
    } else {
      const char* const filename = (const char*)GET_WARGV(argv, c);
      const uint8_t* data = NULL;
      size_t data_size = 0;
      int q;
      ok = ImgIoUtilReadFile(filename, &data, &data_size);
      if (!ok) break;
      q = VP8EstimateQuality(data, data_size);
      if (!quiet) WPRINTF("[%s] ", (const W_CHAR*)filename);
      if (q < 0) {
        fprintf(stderr, "Not a WebP file, or not a lossy WebP file.\n");
        ok = 0;
      } else {
        if (!quiet) {
          printf("Estimated quality factor: %d\n", q);
        } else {
          printf("%d\n", q);   // just print the number
        }
      }
      free((void*)data);
    }
  }
  FREE_WARGV_AND_RETURN(ok ? 0 : 1);
}